

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O3

string * __thiscall
FIX::CharConvertor::convert_abi_cxx11_
          (string *__return_storage_ptr__,CharConvertor *this,char value)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((char)this == '\0') {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string convert( char value )
  {
    if( value == '\0' ) return "";
    return std::string( 1, value );
  }